

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

void __thiscall CVmObjLookupTable::load_image_data(CVmObjLookupTable *this,char *ptr,size_t siz)

{
  int iVar1;
  CVmVarHeap *pCVar2;
  vm_lookup_ext *this_00;
  vm_lookup_val *pvVar3;
  long in_RDX;
  void *in_RSI;
  CVmObjLookupTable *in_RDI;
  vm_lookup_ext *ext;
  vm_lookup_val *eval;
  vm_lookup_val **ebp;
  char *ibp;
  uint i;
  uint val_cnt;
  uint bucket_cnt;
  vm_lookup_ext *in_stack_ffffffffffffff98;
  vm_lookup_ext *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  vm_lookup_ext *this_01;
  vm_lookup_val *local_40;
  vm_lookup_val **local_38;
  void *local_30;
  int local_24;
  
  if ((in_RDI->super_CVmObjCollection).super_CVmObject.ext_ != (char *)0x0) {
    pCVar2 = CVmMemory::get_var_heap(G_mem_X);
    (*pCVar2->_vptr_CVmVarHeap[6])(pCVar2,(in_RDI->super_CVmObjCollection).super_CVmObject.ext_);
  }
  local_24 = ::osrp2(in_RSI);
  iVar1 = ::osrp2((void *)((long)in_RSI + 2));
  this_00 = vm_lookup_ext::alloc_ext
                      (in_RDI,(uint)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                       (uint)in_stack_ffffffffffffffa8);
  (in_RDI->super_CVmObjCollection).super_CVmObject.ext_ = (char *)this_00;
  this_01 = this_00;
  ::osrp2((void *)((long)in_RSI + 4));
  pvVar3 = vm_lookup_ext::img_idx_to_val(this_01,(uint)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  this_00->first_free = pvVar3;
  local_30 = (void *)((long)in_RSI + 6);
  local_38 = this_00->buckets;
  for (; local_24 != 0; local_24 = local_24 + -1) {
    in_stack_ffffffffffffffa0 = this_00;
    ::osrp2(local_30);
    pvVar3 = vm_lookup_ext::img_idx_to_val(this_01,(uint)((ulong)in_stack_ffffffffffffffa0 >> 0x20))
    ;
    *local_38 = pvVar3;
    local_30 = (void *)((long)local_30 + 2);
    local_38 = local_38 + 1;
  }
  local_40 = vm_lookup_ext::idx_to_val(this_00,0);
  for (local_24 = iVar1; local_24 != 0; local_24 = local_24 + -1) {
    vmb_get_dh((char *)in_stack_ffffffffffffffa0,(vm_val_t *)in_stack_ffffffffffffff98);
    vmb_get_dh((char *)in_stack_ffffffffffffffa0,(vm_val_t *)in_stack_ffffffffffffff98);
    in_stack_ffffffffffffff98 = this_00;
    ::osrp2((void *)((long)local_30 + 10));
    pvVar3 = vm_lookup_ext::img_idx_to_val(this_01,(uint)((ulong)in_stack_ffffffffffffffa0 >> 0x20))
    ;
    local_40->nxt = pvVar3;
    local_30 = (void *)((long)local_30 + 0xc);
    local_40 = local_40 + 1;
  }
  vm_val_t::set_nil(&this_00->default_value);
  if ((long)local_30 + 5U <= (ulong)((long)in_RSI + in_RDX)) {
    vmb_get_dh((char *)in_stack_ffffffffffffffa0,(vm_val_t *)in_stack_ffffffffffffff98);
  }
  return;
}

Assistant:

void CVmObjLookupTable::load_image_data(VMG_ const char *ptr, size_t siz)
{
    uint bucket_cnt;
    uint val_cnt;
    uint i;
    const char *ibp;
    vm_lookup_val **ebp;
    vm_lookup_val *eval;
    vm_lookup_ext *ext;

    /* free our existing extension, if we have one */
    if (ext_ != 0)
        G_mem->get_var_heap()->free_mem(ext_);

    /* read the bucket and value counts from the header */
    bucket_cnt = osrp2(ptr);
    val_cnt = osrp2(ptr + 2);

    /* allocate space for a copy of the image data */
    ext = vm_lookup_ext::alloc_ext(vmg_ this, bucket_cnt, val_cnt);
    ext_ = (char *)ext;

    /* initialize the free list pointer, given as a 1-based entry index */
    ext->first_free = ext->img_idx_to_val(osrp2(ptr + 4));

    /* initialize the table from the load image data */
    for (i = bucket_cnt, ibp = ptr + 6, ebp = ext->buckets ;
         i != 0 ; --i, ibp += 2, ++ebp)
    {
        /* translate the image file index to a value pointer */
        *ebp = ext->img_idx_to_val(osrp2(ibp));
    }

    /* initialize the value entries */
    for (i = val_cnt, eval = ext->idx_to_val(0) ;
         i != 0 ; --i, ibp += VMLOOKUP_VALUE_SIZE, ++eval)
    {
        /* read the key and value */
        vmb_get_dh(ibp, &eval->key);
        vmb_get_dh(ibp + VMB_DATAHOLDER, &eval->val);

        /* remember the next pointer, which is given as a 1-based index */
        eval->nxt = ext->img_idx_to_val(osrp2(ibp + VMB_DATAHOLDER*2));
    }

    /* if a default value is included, read it */
    ext->default_value.set_nil();
    if (ibp + VMB_DATAHOLDER <= ptr + siz)
    {
        /* read the default value and skip it in the source data */
        vmb_get_dh(ibp, &ext->default_value);
        ibp += VMB_DATAHOLDER;
    }
}